

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::fresnel::unpolarized::eval(unpolarized *this,float_t zd)

{
  _func_int **pp_Var1;
  void *__s;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  long in_RSI;
  ulong __n;
  long lVar3;
  float fVar4;
  float extraout_XMM0_Db;
  float fVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  value_type vVar11;
  float_t c;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    pp_Var1 = *(_func_int ***)(in_RSI + 8);
    (this->super_impl)._vptr_impl = pp_Var1;
    __n = (long)pp_Var1 << 2;
    __s = operator_new(__n);
    (this->ior)._M_size = (size_t)__s;
    memset(__s,0,__n);
    pfVar2 = extraout_RDX;
    if (0 < *(int *)(in_RSI + 8)) {
      lVar3 = 0;
      do {
        fVar4 = *(float *)(*(long *)(in_RSI + 0x10) + lVar3 * 4);
        fVar4 = fVar4 * fVar4 + zd * zd + -1.0;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
          pfVar2 = extraout_RDX_00;
          fVar7 = extraout_XMM0_Db;
        }
        else {
          fVar4 = SQRT(fVar4);
          fVar7 = 0.0;
        }
        fVar8 = fVar4 + zd;
        fVar9 = zd * fVar8 + -1.0;
        fVar4 = fVar4 - zd;
        fVar10 = zd * fVar4 + 1.0;
        auVar5._0_4_ = fVar4 * fVar4;
        auVar5._4_4_ = fVar9 * fVar9;
        auVar5._8_4_ = fVar7 * fVar7;
        auVar5._12_4_ = 0;
        auVar6._4_4_ = fVar10 * fVar10;
        auVar6._0_4_ = fVar8 * fVar8;
        auVar6._8_4_ = fVar7 * fVar7;
        auVar6._12_4_ = 0;
        auVar6 = divps(auVar5,auVar6);
        *(float *)((long)__s + lVar3 * 4) = (auVar6._4_4_ + 1.0) * auVar6._0_4_ * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 < *(int *)(in_RSI + 8));
    }
    vVar11._M_data = pfVar2;
    vVar11._M_size = (size_t)this;
    return vVar11;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x474,"virtual brdf::value_type djb::fresnel::unpolarized::eval(float_t) const");
}

Assistant:

brdf::value_type unpolarized::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	brdf::value_type F(ior.size());

	for (int i = 0; i < (int)ior.size(); ++i)
		F[i] = unpolarized__eval(zd, ior[i]);

	return F;
}